

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

zip_t * zip_stream_openwitherror(char *stream,size_t size,int level,char mode,int *errnum)

{
  int iVar1;
  uint uVar2;
  mz_bool mVar3;
  zip_t *pZip;
  
  pZip = (zip_t *)calloc(1,0x4e078);
  if (pZip == (zip_t *)0x0) {
    *errnum = -0x15;
  }
  else {
    uVar2 = 6;
    if (-1 < level) {
      uVar2 = level;
    }
    if ((uVar2 & 0xf) < 0xb) {
      pZip->level = uVar2;
      if (mode == 'r' && (size != 0 && stream != (char *)0x0)) {
        mVar3 = mz_zip_reader_init_mem((mz_zip_archive *)pZip,stream,size,0);
        if (mVar3 != 0) {
LAB_001121a4:
          *errnum = 0;
          return pZip;
        }
        iVar1 = -0x1e;
      }
      else if (mode == 'w' && (stream == (char *)0x0 && size == 0)) {
        mVar3 = mz_zip_writer_init_heap((mz_zip_archive *)pZip,0,0x400);
        if (mVar3 != 0) goto LAB_001121a4;
        iVar1 = -0x1f;
      }
      else {
        iVar1 = -4;
      }
    }
    else {
      iVar1 = -5;
    }
    *errnum = iVar1;
    free(pZip);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_stream_openwitherror(const char *stream, size_t size,
                                       int level, char mode, int *errnum) {
  struct zip_t *zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip) {
    // out of memory
    *errnum = ZIP_EOOMEM;
    return NULL;
  }

  if (level < 0) {
    level = MZ_DEFAULT_LEVEL;
  }
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    *errnum = ZIP_EINVLVL;
    goto cleanup;
  }
  zip->level = (mz_uint)level;

  if ((stream != NULL) && (size > 0) && (mode == 'r')) {
    if (!mz_zip_reader_init_mem(&(zip->archive), stream, size, 0)) {
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
  } else if ((stream == NULL) && (size == 0) && (mode == 'w')) {
    // Create a new archive.
    if (!mz_zip_writer_init_heap(&(zip->archive), 0, 1024)) {
      // Cannot initialize zip_archive writer
      *errnum = ZIP_EWINIT;
      goto cleanup;
    }
  } else {
    *errnum = ZIP_EINVMODE;
    goto cleanup;
  }

  *errnum = 0;
  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}